

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::abortRequest(QHttpThreadDelegate *this)

{
  long in_RDI;
  char *unaff_retaddr;
  QObject *in_stack_00000008;
  long lVar1;
  
  lVar1 = in_RDI;
  if (*(long *)(in_RDI + 0x150) != 0) {
    QHttpNetworkReply::abort(*(QHttpNetworkReply **)(in_RDI + 0x150));
    if (*(long **)(in_RDI + 0x150) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x150) + 0x20))();
    }
    *(undefined8 *)(in_RDI + 0x150) = 0;
  }
  if ((*(byte *)(in_RDI + 0x88) & 1) == 0) {
    QObject::deleteLater();
  }
  else {
    *(undefined4 *)(in_RDI + 0xf0) = 4;
    QMetaObject::invokeMethod<>
              (in_stack_00000008,unaff_retaddr,(ConnectionType)((ulong)lVar1 >> 0x20));
  }
  return;
}

Assistant:

void QHttpThreadDelegate::abortRequest()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::abortRequest() thread=" << QThread::currentThreadId() << "sync=" << synchronous;
#endif
    if (httpReply) {
        httpReply->abort();
        delete httpReply;
        httpReply = nullptr;
    }

    // Got aborted by the timeout timer
    if (synchronous) {
        incomingErrorCode = QNetworkReply::TimeoutError;
        QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    } else {
        //only delete this for asynchronous mode or QNetworkAccessHttpBackend will crash - see QNetworkAccessHttpBackend::postRequest()
        this->deleteLater();
    }
}